

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetFacialExpressionBlendShapePropertiesML
                   (XrFacialExpressionClientML facialExpressionClient,
                   XrFacialExpressionBlendShapeGetInfoML *blendShapeGetInfo,uint32_t blendShapeCount
                   ,XrFacialExpressionBlendShapePropertiesML *blendShapes)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_5c9;
  string local_5c8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5a8;
  allocator local_589;
  string local_588 [39];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [32];
  uint local_518;
  allocator local_511;
  uint32_t value_blendshapes_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4f0;
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_460;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3d0;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_318;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  GenValidUsageXrInstanceInfo *local_2b0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_facialexpressionclientml_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrFacialExpressionClientML_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrFacialExpressionBlendShapePropertiesML *blendShapes_local;
  uint32_t blendShapeCount_local;
  XrFacialExpressionBlendShapeGetInfoML *blendShapeGetInfo_local;
  XrFacialExpressionClientML facialExpressionClient_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  blendShapeGetInfo_local = (XrFacialExpressionBlendShapeGetInfoML *)facialExpressionClient;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrFacialExpressionClientML_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,(XrFacialExpressionClientML_T **)&blendShapeGetInfo_local,&local_54);
  VVar1 = VerifyXrFacialExpressionClientMLHandle
                    ((XrFacialExpressionClientML *)&blendShapeGetInfo_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrFacialExpressionClientML_T_*>::getWithInstanceInfo
                      (&g_facialexpressionclientml_info,
                       (XrFacialExpressionClientML_T *)blendShapeGetInfo_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2b0 = pGVar2;
    gen_facialexpressionclientml_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (blendShapeGetInfo == (XrFacialExpressionBlendShapeGetInfoML *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d0,
                 "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                 &local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2f8,"xrGetFacialExpressionBlendShapePropertiesML",&local_2f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_318,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_338,
                 "Invalid NULL for XrFacialExpressionBlendShapeGetInfoML \"blendShapeGetInfo\" which is not optional and must be non-NULL"
                 ,&local_339);
      CoreValidLogMessage(pGVar2,(string *)local_2d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f8,&local_318,(string *)local_338);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_318);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      facialExpressionClient_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_360,"xrGetFacialExpressionBlendShapePropertiesML",&local_361);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_360,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_50,true,true,blendShapeGetInfo);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      pGVar2 = local_2b0;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if ((blendShapeCount == 0) &&
           (blendShapes != (XrFacialExpressionBlendShapePropertiesML *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_418,
                     "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeCount-arraylength",
                     &local_419);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_440,"xrGetFacialExpressionBlendShapePropertiesML",&local_441);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_460,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_480,
                     "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeCount is non-optional and must be greater than 0"
                     ,&local_481);
          CoreValidLogMessage(pGVar2,(string *)local_418,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_440,&local_460,(string *)local_480);
          std::__cxx11::string::~string(local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_460);
          std::__cxx11::string::~string(local_440);
          std::allocator<char>::~allocator((allocator<char> *)&local_441);
          std::__cxx11::string::~string(local_418);
          std::allocator<char>::~allocator((allocator<char> *)&local_419);
          objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        pGVar2 = local_2b0;
        if ((blendShapes == (XrFacialExpressionBlendShapePropertiesML *)0x0) &&
           (blendShapeCount != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4a8,
                     "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                     &local_4a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4d0,"xrGetFacialExpressionBlendShapePropertiesML",&local_4d1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_4f0,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&value_blendshapes_inc,
                     "Invalid NULL for XrFacialExpressionBlendShapePropertiesML \"blendShapes\" is which not optional since \"blendShapeCount\" is set and must be non-NULL"
                     ,&local_511);
          CoreValidLogMessage(pGVar2,(string *)local_4a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_4d0,&local_4f0,(string *)&value_blendshapes_inc);
          std::__cxx11::string::~string((string *)&value_blendshapes_inc);
          std::allocator<char>::~allocator((allocator<char> *)&local_511);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_4f0);
          std::__cxx11::string::~string(local_4d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
          std::__cxx11::string::~string(local_4a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
          facialExpressionClient_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          if (blendShapes != (XrFacialExpressionBlendShapePropertiesML *)0x0) {
            for (local_518 = 0; pGVar2 = local_2b0, local_518 < blendShapeCount;
                local_518 = local_518 + 1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_538,"xrGetFacialExpressionBlendShapePropertiesML",&local_539);
              objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   ValidateXrStruct(pGVar2,(string *)local_538,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)local_50,true,true,blendShapes + local_518);
              std::__cxx11::string::~string(local_538);
              std::allocator<char>::~allocator((allocator<char> *)&local_539);
              pGVar2 = local_2b0;
              if (objects_info.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_560,
                           "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                           &local_561);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_588,"xrGetFacialExpressionBlendShapePropertiesML",&local_589);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_5a8,
                       (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)local_50);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5c8,
                           "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapes is invalid"
                           ,&local_5c9);
                CoreValidLogMessage(pGVar2,(string *)local_560,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                    (string *)local_588,&local_5a8,(string *)local_5c8);
                std::__cxx11::string::~string(local_5c8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_5a8);
                std::__cxx11::string::~string(local_588);
                std::allocator<char>::~allocator((allocator<char> *)&local_589);
                std::__cxx11::string::~string(local_560);
                std::allocator<char>::~allocator((allocator<char> *)&local_561);
                facialExpressionClient_local._4_4_ =
                     objects_info.
                     super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                info_with_instance.second._4_4_ = 1;
                goto LAB_00340103;
              }
            }
          }
          facialExpressionClient_local._4_4_ =
               objects_info.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          info_with_instance.second._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_388,
                   "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                   &local_389);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3b0,"xrGetFacialExpressionBlendShapePropertiesML",&local_3b1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3d0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3f0,
                   "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeGetInfo is invalid"
                   ,&local_3f1);
        CoreValidLogMessage(pGVar2,(string *)local_388,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3b0,&local_3d0,(string *)local_3f0);
        std::__cxx11::string::~string(local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3d0);
        std::__cxx11::string::~string(local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
        std::__cxx11::string::~string(local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        facialExpressionClient_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,
                    "Invalid XrFacialExpressionClientML handle \"facialExpressionClient\" ");
    HandleToHexString<XrFacialExpressionClientML_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,
               "VUID-xrGetFacialExpressionBlendShapePropertiesML-facialExpressionClient-parameter",
               &local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrGetFacialExpressionBlendShapePropertiesML",&local_249)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    facialExpressionClient_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
LAB_00340103:
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return facialExpressionClient_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetFacialExpressionBlendShapePropertiesML(
XrFacialExpressionClientML facialExpressionClient,
const XrFacialExpressionBlendShapeGetInfoML* blendShapeGetInfo,
uint32_t blendShapeCount,
XrFacialExpressionBlendShapePropertiesML* blendShapes) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(facialExpressionClient, XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrFacialExpressionClientMLHandle(&facialExpressionClient);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrFacialExpressionClientML handle \"facialExpressionClient\" ";
                oss << HandleToHexString(facialExpressionClient);
                CoreValidLogMessage(nullptr, "VUID-xrGetFacialExpressionBlendShapePropertiesML-facialExpressionClient-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_facialexpressionclientml_info.getWithInstanceInfo(facialExpressionClient);
        GenValidUsageXrHandleInfo *gen_facialexpressionclientml_info = info_with_instance.first;
        (void)gen_facialexpressionclientml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == blendShapeGetInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                "Invalid NULL for XrFacialExpressionBlendShapeGetInfoML \"blendShapeGetInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrFacialExpressionBlendShapeGetInfoML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                                        true, true, blendShapeGetInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                objects_info,
                                "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeGetInfo is invalid");
            return xr_result;
        }
        // Non-optional array length must be non-zero
        if (0 >= blendShapeCount && nullptr != blendShapes) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeCount-arraylength",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                objects_info,
                                "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeCount is non-optional and must be greater than 0");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
        // Pointer/array variable with a length variable.  Make sure that
        // if length variable is non-zero that the pointer is not NULL
        if (nullptr == blendShapes && 0 != blendShapeCount) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                "Invalid NULL for XrFacialExpressionBlendShapePropertiesML \"blendShapes\" is which not "
                                "optional since \"blendShapeCount\" is set and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        if (blendShapes) {
            for (uint32_t value_blendshapes_inc = 0; value_blendshapes_inc < blendShapeCount; ++value_blendshapes_inc) {
                // Validate that the structure XrFacialExpressionBlendShapePropertiesML is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                                                true, true, &blendShapes[value_blendshapes_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                        objects_info,
                                        "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapes is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}